

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl-tls.c
# Opt level: O0

char * lws_ssl_get_error_string(int status,int ret,char *buf,size_t len)

{
  int *piVar1;
  char *pcVar2;
  size_t len_local;
  char *buf_local;
  int ret_local;
  int status_local;
  
  switch(status) {
  case 0:
    _ret_local = lws_strncpy(buf,"SSL_ERROR_NONE",len);
    break;
  case 1:
    _ret_local = "SSL_ERROR_SSL";
    break;
  case 2:
    _ret_local = lws_strncpy(buf,"SSL_ERROR_WANT_READ",len);
    break;
  case 3:
    _ret_local = lws_strncpy(buf,"SSL_ERROR_WANT_WRITE",len);
    break;
  case 4:
    _ret_local = lws_strncpy(buf,"SSL_ERROR_WANT_X509_LOOKUP",len);
    break;
  case 5:
    _ret_local = buf;
    if (ret == -1) {
      piVar1 = __errno_location();
      pcVar2 = strerror(*piVar1);
      lws_snprintf(buf,len,"SSL_ERROR_SYSCALL: %s",pcVar2);
    }
    else if (ret == 0) {
      lws_snprintf(buf,len,"SSL_ERROR_SYSCALL: EOF");
    }
    else {
      _ret_local = strncpy(buf,"SSL_ERROR_SYSCALL",len);
    }
    break;
  case 6:
    _ret_local = lws_strncpy(buf,"SSL_ERROR_ZERO_RETURN",len);
    break;
  case 7:
    _ret_local = lws_strncpy(buf,"SSL_ERROR_WANT_CONNECT",len);
    break;
  case 8:
    _ret_local = lws_strncpy(buf,"SSL_ERROR_WANT_ACCEPT",len);
    break;
  default:
    _ret_local = "SSL_ERROR_UNKNOWN";
  }
  return _ret_local;
}

Assistant:

char* lws_ssl_get_error_string(int status, int ret, char *buf, size_t len) {
	switch (status) {
	case SSL_ERROR_NONE:
		return lws_strncpy(buf, "SSL_ERROR_NONE", len);
	case SSL_ERROR_ZERO_RETURN:
		return lws_strncpy(buf, "SSL_ERROR_ZERO_RETURN", len);
	case SSL_ERROR_WANT_READ:
		return lws_strncpy(buf, "SSL_ERROR_WANT_READ", len);
	case SSL_ERROR_WANT_WRITE:
		return lws_strncpy(buf, "SSL_ERROR_WANT_WRITE", len);
	case SSL_ERROR_WANT_CONNECT:
		return lws_strncpy(buf, "SSL_ERROR_WANT_CONNECT", len);
	case SSL_ERROR_WANT_ACCEPT:
		return lws_strncpy(buf, "SSL_ERROR_WANT_ACCEPT", len);
	case SSL_ERROR_WANT_X509_LOOKUP:
		return lws_strncpy(buf, "SSL_ERROR_WANT_X509_LOOKUP", len);
	case SSL_ERROR_SYSCALL:
		switch (ret) {
                case 0:
                        lws_snprintf(buf, len, "SSL_ERROR_SYSCALL: EOF");
                        return buf;
                case -1:
#ifndef LWS_PLAT_OPTEE
			lws_snprintf(buf, len, "SSL_ERROR_SYSCALL: %s",
				     strerror(errno));
#else
			lws_snprintf(buf, len, "SSL_ERROR_SYSCALL: %d", errno);
#endif
			return buf;
                default:
                        return strncpy(buf, "SSL_ERROR_SYSCALL", len);
	}
	case SSL_ERROR_SSL:
		return "SSL_ERROR_SSL";
	default:
		return "SSL_ERROR_UNKNOWN";
	}
}